

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readArray(OurReader *this,Token *tokenStart)

{
  undefined1 uVar1;
  Value *pVVar2;
  OurReader *this_00;
  long in_RSI;
  OurReader *in_RDI;
  bool badTokenType;
  Token token;
  bool ok;
  int in_stack_0000009c;
  Value *value;
  int index;
  Token endArray;
  Value init;
  undefined4 in_stack_fffffffffffffee8;
  TokenType in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  Value *in_stack_fffffffffffffef8;
  string *message;
  undefined2 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff02;
  undefined1 in_stack_ffffffffffffff03;
  undefined1 in_stack_ffffffffffffff04;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  TokenType skipUntilToken;
  undefined1 local_c9 [40];
  undefined1 local_a1;
  int local_a0;
  bool local_81;
  Value *local_80;
  Value *local_78;
  int local_70;
  undefined4 local_6c;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  Value::Value((Value *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,
                                          CONCAT15(in_stack_ffffffffffffff05,
                                                   CONCAT14(in_stack_ffffffffffffff04,
                                                            CONCAT13(in_stack_ffffffffffffff03,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
               (ValueType)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  currentValue((OurReader *)0x173f90);
  Value::swapPayload((Value *)CONCAT17(in_stack_ffffffffffffff07,
                                       CONCAT16(in_stack_ffffffffffffff06,
                                                CONCAT15(in_stack_ffffffffffffff05,
                                                         CONCAT14(in_stack_ffffffffffffff04,
                                                                  CONCAT13(in_stack_ffffffffffffff03
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                     in_stack_fffffffffffffef8);
  pVVar2 = currentValue((OurReader *)0x173fb5);
  Value::setOffsetStart(pVVar2,*(long *)(local_18 + 8) - (long)in_RDI->begin_);
  skipSpaces(in_RDI);
  if (*in_RDI->current_ == ']') {
    readToken((OurReader *)
              CONCAT17(in_stack_ffffffffffffff07,
                       CONCAT16(in_stack_ffffffffffffff06,
                                CONCAT15(in_stack_ffffffffffffff05,
                                         CONCAT14(in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))),
              (Token *)in_stack_fffffffffffffef8);
    local_1 = 1;
  }
  else {
    local_70 = 0;
    while( true ) {
      this_00 = (OurReader *)currentValue((OurReader *)0x17405b);
      local_70 = local_70 + 1;
      pVVar2 = Value::operator[](value,in_stack_0000009c);
      local_80 = pVVar2;
      local_78 = pVVar2;
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
                ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *
                 )CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      skipUntilToken = (TokenType)((ulong)pVVar2 >> 0x20);
      uVar1 = readValue((OurReader *)token.end_);
      local_81 = (bool)uVar1;
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
                ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *
                 )0x1740dd);
      if ((local_81 & 1U) == 0) break;
      in_stack_ffffffffffffff05 =
           readToken((OurReader *)
                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff06,
                                             CONCAT15(in_stack_ffffffffffffff05,
                                                      CONCAT14(in_stack_ffffffffffffff04,
                                                               CONCAT13(in_stack_ffffffffffffff03,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                     (Token *)in_stack_fffffffffffffef8);
      local_81 = (bool)in_stack_ffffffffffffff05;
      while( true ) {
        uVar3 = false;
        if (local_a0 == 0xc) {
          uVar3 = local_81;
        }
        if ((bool)uVar3 == false) break;
        in_stack_ffffffffffffff03 =
             readToken((OurReader *)
                       CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff06,
                                               CONCAT15(in_stack_ffffffffffffff05,
                                                        CONCAT14(uVar3,CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                       (Token *)in_stack_fffffffffffffef8);
        local_81 = (bool)in_stack_ffffffffffffff03;
      }
      in_stack_ffffffffffffff02 = local_a0 != 10 && local_a0 != 4;
      local_a1 = in_stack_ffffffffffffff02;
      if ((local_81 == false) || (local_a0 != 10 && local_a0 != 4)) {
        message = (string *)local_c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_c9 + 1),"Missing \',\' or \']\' in array declaration",
                   (allocator *)message);
        local_1 = addErrorAndRecover((OurReader *)
                                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff06,
                                                             CONCAT15(in_stack_ffffffffffffff05,
                                                                      CONCAT14(uVar3,CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),message,
                                     (Token *)CONCAT17(in_stack_fffffffffffffef7,
                                                       in_stack_fffffffffffffef0),
                                     in_stack_fffffffffffffeec);
        std::__cxx11::string::~string((string *)(local_c9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_c9);
        goto LAB_00174290;
      }
      if (local_a0 == 4) {
        local_1 = 1;
        goto LAB_00174290;
      }
      in_stack_ffffffffffffff04 = 0;
    }
    local_1 = recoverFromError(this_00,skipUntilToken);
  }
LAB_00174290:
  local_6c = 1;
  Value::~Value((Value *)in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::readArray(Token& tokenStart) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}